

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9RegisterBuiltInFunction(jx9_vm *pVm)

{
  uint local_14;
  sxu32 n;
  jx9_vm *pVm_local;
  
  for (local_14 = 0; local_14 < 0x76; local_14 = local_14 + 1) {
    jx9_create_function(pVm,aBuiltInFunc[local_14].zName,aBuiltInFunc[local_14].xFunc,(void *)0x0);
  }
  jx9RegisterHashmapFunctions(pVm);
  jx9RegisterIORoutine(pVm);
  return;
}

Assistant:

JX9_PRIVATE void jx9RegisterBuiltInFunction(jx9_vm *pVm)
{
	sxu32 n;
	for( n = 0 ; n < SX_ARRAYSIZE(aBuiltInFunc) ; ++n ){
		jx9_create_function(&(*pVm), aBuiltInFunc[n].zName, aBuiltInFunc[n].xFunc, 0);
	}
	/* Register hashmap functions [i.e: sort(), count(), array_diff(), ...] */
	jx9RegisterHashmapFunctions(&(*pVm));
	/* Register IO functions [i.e: fread(), fwrite(), chdir(), mkdir(), file(), ...] */
	jx9RegisterIORoutine(&(*pVm));
}